

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLURL::buildFullText(XMLURL *this)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  XMLSize_t XVar7;
  undefined4 extraout_var;
  XMLCh *src;
  XMLCh *pXVar8;
  XMLCh local_48 [4];
  XMLCh tmpBuf [17];
  XMLCh *outPtr;
  XMLSize_t bufSize;
  XMLURL *this_local;
  
  XVar2 = XMLString::stringLen(this->fFragment);
  XVar3 = XMLString::stringLen(this->fHost);
  XVar4 = XMLString::stringLen(this->fPassword);
  XVar5 = XMLString::stringLen(this->fPath);
  XVar6 = XMLString::stringLen(this->fQuery);
  XVar7 = XMLString::stringLen(this->fUser);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fURLText);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(XVar2 + XVar3 + XVar4 + XVar5 + XVar6 + XVar7 + 0x2c) * 2
                    );
  this->fURLText = (XMLCh *)CONCAT44(extraout_var,iVar1);
  *this->fURLText = L'\0';
  unique0x00012000 = this->fURLText;
  if (this->fProtocol != Unknown) {
    pXVar8 = this->fURLText;
    src = getProtocolName(this);
    XMLString::catString(pXVar8,src);
    XVar2 = XMLString::stringLen(this->fURLText);
    pXVar8 = stack0xffffffffffffffe0 + XVar2;
    *pXVar8 = L':';
    pXVar8[1] = L'/';
    register0x00000008 = pXVar8 + 3;
    pXVar8[2] = L'/';
  }
  if (this->fUser != (XMLCh *)0x0) {
    XMLString::copyString(stack0xffffffffffffffe0,this->fUser);
    XVar2 = XMLString::stringLen(this->fUser);
    pXVar8 = stack0xffffffffffffffe0 + XVar2;
    unique0x10000412 = pXVar8;
    if (this->fPassword != (XMLCh *)0x0) {
      register0x00000010 = pXVar8 + 1;
      *pXVar8 = L':';
      XMLString::copyString(register0x00000010,this->fPassword);
      XVar2 = XMLString::stringLen(this->fPassword);
      register0x00000000 = stack0xffffffffffffffe0 + XVar2;
    }
    *stack0xffffffffffffffe0 = L'@';
    unique0x1000040a = stack0xffffffffffffffe0 + 1;
  }
  if (this->fHost != (XMLCh *)0x0) {
    XMLString::copyString(stack0xffffffffffffffe0,this->fHost);
    XVar2 = XMLString::stringLen(this->fHost);
    pXVar8 = stack0xffffffffffffffe0 + XVar2;
    unique0x100003fa = pXVar8;
    if (this->fPortNum != 0) {
      register0x00000010 = pXVar8 + 1;
      *pXVar8 = L':';
      XMLString::binToText(this->fPortNum,local_48,0x10,10,this->fMemoryManager);
      XMLString::copyString(stack0xffffffffffffffe0,local_48);
      XVar2 = XMLString::stringLen(local_48);
      register0x00000000 = stack0xffffffffffffffe0 + XVar2;
    }
  }
  if (this->fPath != (XMLCh *)0x0) {
    XMLString::copyString(stack0xffffffffffffffe0,this->fPath);
    XVar2 = XMLString::stringLen(this->fPath);
    register0x00000000 = stack0xffffffffffffffe0 + XVar2;
  }
  if (this->fQuery != (XMLCh *)0x0) {
    pXVar8 = stack0xffffffffffffffe0 + 1;
    *stack0xffffffffffffffe0 = L'?';
    unique0x100003e2 = pXVar8;
    XMLString::copyString(pXVar8,this->fQuery);
    XVar2 = XMLString::stringLen(this->fQuery);
    register0x00000000 = stack0xffffffffffffffe0 + XVar2;
  }
  if (this->fFragment != (XMLCh *)0x0) {
    pXVar8 = stack0xffffffffffffffe0 + 1;
    *stack0xffffffffffffffe0 = L'#';
    unique0x100003ea = pXVar8;
    XMLString::copyString(pXVar8,this->fFragment);
    XVar2 = XMLString::stringLen(this->fFragment);
    register0x00000000 = stack0xffffffffffffffe0 + XVar2;
  }
  *stack0xffffffffffffffe0 = L'\0';
  return;
}

Assistant:

void XMLURL::buildFullText()
{
    // Calculate the worst case size of the buffer required
    XMLSize_t bufSize = gMaxProtoLen + 1
                           + XMLString::stringLen(fFragment) + 1
                           + XMLString::stringLen(fHost) + 2
                           + XMLString::stringLen(fPassword) + 1
                           + XMLString::stringLen(fPath)
                           + XMLString::stringLen(fQuery) + 1
                           + XMLString::stringLen(fUser) + 1
                           + 32;

    // Clean up the existing buffer and allocate another
    fMemoryManager->deallocate(fURLText);//delete [] fURLText;
    fURLText = (XMLCh*) fMemoryManager->allocate((bufSize) * sizeof(XMLCh));//new XMLCh[bufSize];
    *fURLText = 0;

    XMLCh* outPtr = fURLText;
    if (fProtocol != Unknown)
    {
        XMLString::catString(fURLText, getProtocolName());
        outPtr += XMLString::stringLen(fURLText);
        *outPtr++ = chColon;
        *outPtr++ = chForwardSlash;
        *outPtr++ = chForwardSlash;
    }

    if (fUser)
    {
        XMLString::copyString(outPtr, fUser);
        outPtr += XMLString::stringLen(fUser);

        if (fPassword)
        {
            *outPtr++ = chColon;
            XMLString::copyString(outPtr, fPassword);
            outPtr += XMLString::stringLen(fPassword);
        }

        *outPtr++ = chAt;
    }

    if (fHost)
    {
        XMLString::copyString(outPtr, fHost);
        outPtr += XMLString::stringLen(fHost);

        //
        //  If the port is zero, then we don't put it in. Else we need
        //  to because it was explicitly provided.
        //
        if (fPortNum)
        {
            *outPtr++ = chColon;

            XMLCh tmpBuf[17];
            XMLString::binToText(fPortNum, tmpBuf, 16, 10, fMemoryManager);
            XMLString::copyString(outPtr, tmpBuf);
            outPtr += XMLString::stringLen(tmpBuf);
        }
    }

    if (fPath)
    {
        XMLString::copyString(outPtr, fPath);
        outPtr += XMLString::stringLen(fPath);
    }

    if (fQuery)
    {
        *outPtr++ = chQuestion;
        XMLString::copyString(outPtr, fQuery);
        outPtr += XMLString::stringLen(fQuery);
    }

    if (fFragment)
    {
        *outPtr++ = chPound;
        XMLString::copyString(outPtr, fFragment);
        outPtr += XMLString::stringLen(fFragment);
    }

    // Cap it off in case the last op was not a string copy
    *outPtr = 0;
}